

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

TScoredWords * __thiscall
NJamSpell::TSpellCorrector::GetCandidatesRawWithScores
          (TScoredWords *__return_storage_ptr__,TSpellCorrector *this,TWords *sentence,
          size_t position)

{
  size_type *psVar1;
  pointer *ppTVar2;
  double dVar3;
  iterator __position;
  pointer pTVar4;
  wchar_t *pwVar5;
  size_t sVar6;
  size_t sVar7;
  TWord origWord;
  pointer pTVar8;
  iterator iVar9;
  pointer pTVar10;
  pointer pTVar11;
  pointer pTVar12;
  TWord *pTVar13;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
  __i;
  pointer pTVar17;
  bool bVar18;
  bool bVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  wchar_t wVar22;
  wchar_t wVar23;
  undefined1 auStack_f8 [8];
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  uniqueCandidates;
  undefined1 auStack_b8 [8];
  TWord cand;
  double local_98;
  undefined1 auStack_88 [8];
  TWord w;
  iterator local_70;
  TWord *pTStack_68;
  undefined1 auStack_58 [8];
  TWord c;
  
  iVar9._M_current = local_70._M_current;
  (__return_storage_ptr__->
  super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar12 = (sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(sentence->
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)pTVar12 >> 4) <= position) {
    return __return_storage_ptr__;
  }
  pTVar12 = pTVar12 + position;
  pwVar5 = pTVar12->Ptr;
  sVar6 = pTVar12->Len;
  pTVar13 = (TWord *)auStack_88;
  auStack_88._0_4_ = SUB84(pwVar5,0);
  auStack_88._4_4_ = (undefined4)((ulong)pwVar5 >> 0x20);
  w.Ptr._0_4_ = (undefined4)sVar6;
  w.Ptr._4_4_ = (undefined4)(sVar6 >> 0x20);
  Edits2((TWords *)&w.Len,this,pTVar13,true);
  sVar6 = w.Len;
  if ((TWord *)w.Len == local_70._M_current) {
    Edits((TWords *)auStack_f8,this,(TWord *)auStack_88);
    sVar7 = w.Len;
    w.Len = (size_t)auStack_f8;
    local_70._M_current = (TWord *)uniqueCandidates._M_h._M_buckets;
    pTStack_68 = (TWord *)uniqueCandidates._M_h._M_bucket_count;
    auStack_f8 = (undefined1  [8])0x0;
    uniqueCandidates._M_h._M_buckets = (__buckets_ptr)0x0;
    uniqueCandidates._M_h._M_bucket_count = 0;
    if (sVar7 != 0) {
      operator_delete((void *)sVar7);
    }
    if (auStack_f8 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_f8);
    }
  }
  if ((TWord *)w.Len == local_70._M_current) goto LAB_00125acf;
  psVar1 = &uniqueCandidates._M_h._M_bucket_count;
  auStack_f8 = (undefined1  [8])psVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)auStack_f8,CONCAT44(auStack_88._4_4_,auStack_88._0_4_),
             CONCAT44(auStack_88._4_4_,auStack_88._0_4_) + CONCAT44(w.Ptr._4_4_,w.Ptr._0_4_) * 4);
  _auStack_58 = TLangModel::GetWord(&this->LangModel,(wstring *)auStack_f8);
  if (auStack_f8 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_f8);
  }
  bVar18 = auStack_58 == (undefined1  [8])0x0;
  bVar19 = c.Ptr == (wchar_t *)0x0;
  if (bVar19 || bVar18) {
    if (local_70._M_current == pTStack_68) goto LAB_001257e4;
LAB_001257d5:
    *(undefined4 *)&(local_70._M_current)->Ptr = auStack_88._0_4_;
    *(undefined4 *)((long)&(local_70._M_current)->Ptr + 4) = auStack_88._4_4_;
    *(undefined4 *)&(local_70._M_current)->Len = w.Ptr._0_4_;
    *(undefined4 *)((long)&(local_70._M_current)->Len + 4) = w.Ptr._4_4_;
    local_70._M_current = local_70._M_current + 1;
  }
  else {
    auStack_88._0_4_ = auStack_58._0_4_;
    auStack_88._4_4_ = auStack_58._4_4_;
    w.Ptr._0_4_ = auStack_58._8_4_;
    w.Ptr._4_4_ = auStack_58._12_4_;
    if (local_70._M_current != pTStack_68) goto LAB_001257d5;
    pTVar13 = (TWord *)auStack_58;
LAB_001257e4:
    std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
    _M_realloc_insert<NJamSpell::TWord_const&>
              ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)&w.Len,local_70,pTVar13)
    ;
  }
  std::
  _Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<NJamSpell::TWord*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
            ((_Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)auStack_f8,w.Len,local_70._M_current,0,auStack_58,&cand.Len,auStack_b8);
  origWord.Ptr._4_4_ = auStack_88._4_4_;
  origWord.Ptr._0_4_ = auStack_88._0_4_;
  origWord.Len._0_4_ = w.Ptr._0_4_;
  origWord.Len._4_4_ = w.Ptr._4_4_;
  FilterCandidatesByFrequency
            (this,(unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                   *)auStack_f8,origWord);
  std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::reserve
            (__return_storage_ptr__,(size_type)uniqueCandidates._M_h._M_before_begin._M_nxt);
  if (uniqueCandidates._M_h._M_bucket_count != 0) {
    plVar14 = (long *)uniqueCandidates._M_h._M_bucket_count;
    do {
      auStack_b8 = (undefined1  [8])plVar14[1];
      cand.Ptr = (wchar_t *)plVar14[2];
      _auStack_58 = (TWord)ZEXT816(0);
      c.Len = 0;
      pTVar12 = (sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
          _M_impl.super__Vector_impl_data._M_finish != pTVar12) {
        lVar16 = 0;
        uVar15 = 0;
        do {
          if (position == uVar15) {
            if (c.Ptr == (wchar_t *)c.Len) {
              pTVar13 = (TWord *)auStack_b8;
LAB_001258f0:
              std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
              _M_realloc_insert<NJamSpell::TWord_const&>
                        ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)auStack_58,
                         (iterator)c.Ptr,pTVar13);
            }
            else {
              wVar20 = auStack_b8._0_4_;
              wVar21 = auStack_b8._4_4_;
              wVar22 = (wchar_t)cand.Ptr;
              wVar23 = cand.Ptr._4_4_;
LAB_001258de:
              *c.Ptr = wVar20;
              c.Ptr[1] = wVar21;
              c.Ptr[2] = wVar22;
              c.Ptr[3] = wVar23;
              c.Ptr = c.Ptr + 4;
            }
          }
          else if ((uVar15 < position && position <= uVar15 + 2) ||
                  (uVar15 <= position + 2 && position < uVar15)) {
            pTVar13 = (TWord *)((long)&pTVar12->Ptr + lVar16);
            if (c.Ptr == (wchar_t *)c.Len) goto LAB_001258f0;
            wVar20 = *(wchar_t *)&pTVar13->Ptr;
            wVar21 = *(wchar_t *)((long)&pTVar13->Ptr + 4);
            wVar22 = (wchar_t)pTVar13->Len;
            wVar23 = *(wchar_t *)((long)&pTVar13->Len + 4);
            goto LAB_001258de;
          }
          uVar15 = uVar15 + 1;
          pTVar12 = (sentence->
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl
                    .super__Vector_impl_data._M_start;
          lVar16 = lVar16 + 0x10;
        } while (uVar15 < (ulong)((long)(sentence->
                                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar12
                                 >> 4));
      }
      pwVar5 = cand.Ptr;
      cand.Len = (size_t)auStack_b8;
      local_98 = TLangModel::Score(&this->LangModel,(TWords *)auStack_58);
      if ((cand.Len != CONCAT44(auStack_88._4_4_,auStack_88._0_4_)) ||
         (pwVar5 != (wchar_t *)CONCAT44(w.Ptr._4_4_,w.Ptr._0_4_))) {
        if (bVar19 || bVar18) {
          local_98 = local_98 - this->UnknownWordsPenalty;
        }
        else if ((TWord *)sVar6 == iVar9._M_current) {
          local_98 = local_98 * 50.0;
        }
        else {
          local_98 = local_98 - this->KnownWordsPenalty;
        }
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>::
        _M_realloc_insert<NJamSpell::TScoredWord_const&>
                  ((vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>> *)
                   __return_storage_ptr__,__position,(TScoredWord *)&cand.Len);
      }
      else {
        (__position._M_current)->Score = local_98;
        ((__position._M_current)->Word).Ptr = (wchar_t *)cand.Len;
        ((__position._M_current)->Word).Len = (size_t)pwVar5;
        ppTVar2 = &(__return_storage_ptr__->
                   super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar2 = *ppTVar2 + 1;
      }
      if (auStack_58 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_58);
      }
      plVar14 = (long *)*plVar14;
    } while (plVar14 != (long *)0x0);
  }
  pTVar10 = (__return_storage_ptr__->
            super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (__return_storage_ptr__->
           super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar10 != pTVar4) {
    uVar15 = ((long)pTVar4 - (long)pTVar10 >> 3) * -0x5555555555555555;
    lVar16 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRawWithScores(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
              (pTVar10,pTVar4,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar4 - (long)pTVar10 < 0x181) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRawWithScores(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                (pTVar10,pTVar4);
    }
    else {
      pTVar17 = pTVar10 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRawWithScores(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                (pTVar10,pTVar17);
      for (; pTVar17 != pTVar4; pTVar17 = pTVar17 + 1) {
        pwVar5 = (pTVar17->Word).Ptr;
        sVar6 = (pTVar17->Word).Len;
        _auStack_58 = pTVar17->Word;
        dVar3 = pTVar17->Score;
        pTVar10 = pTVar17;
        pTVar11 = pTVar17;
        if (pTVar17[-1].Score <= dVar3 && dVar3 != pTVar17[-1].Score) {
          do {
            pTVar10 = pTVar11 + -1;
            pTVar11->Score = pTVar11[-1].Score;
            sVar7 = pTVar11[-1].Word.Len;
            (pTVar11->Word).Ptr = pTVar11[-1].Word.Ptr;
            (pTVar11->Word).Len = sVar7;
            pTVar8 = pTVar11 + -2;
            pTVar11 = pTVar10;
          } while (pTVar8->Score <= dVar3 && dVar3 != pTVar8->Score);
        }
        (pTVar10->Word).Ptr = pwVar5;
        (pTVar10->Word).Len = sVar6;
        pTVar10->Score = dVar3;
      }
    }
  }
  std::
  _Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)auStack_f8);
LAB_00125acf:
  if (w.Len != 0) {
    operator_delete((void *)w.Len);
  }
  return __return_storage_ptr__;
}

Assistant:

TScoredWords TSpellCorrector::GetCandidatesRawWithScores(const TWords& sentence, size_t position) const {
    TScoredWords scoredCandidates;

    if (position >= sentence.size()) {
        return scoredCandidates;
    }

    TWord w = sentence[position];
    TWords candidates = Edits2(w);

    bool firstLevel = true;
    bool knownWord = false;
    if (candidates.empty()) {
        candidates = Edits(w);
        firstLevel = false;
    }

    if (candidates.empty()) {
        return scoredCandidates;
    }

    {
        TWord c = LangModel.GetWord(std::wstring(w.Ptr, w.Len));
        if (c.Ptr && c.Len) {
            w = c;
            candidates.push_back(c);
            knownWord = true;
        } else {
            candidates.push_back(w);
        }
    }

    std::unordered_set<TWord, TWordHashPtr> uniqueCandidates(candidates.begin(), candidates.end());

    FilterCandidatesByFrequency(uniqueCandidates, w);
    scoredCandidates.reserve(uniqueCandidates.size());

    for (TWord cand: uniqueCandidates) {
        TWords candSentence;
        for (size_t i = 0; i < sentence.size(); ++i) {
            if (i == position) {
                candSentence.push_back(cand);
            } else if ((i < position && i + 2 >= position) ||
                       (i > position && i <= position + 2))
            {
                candSentence.push_back(sentence[i]);
            }
        }

        TScoredWord scored;
        scored.Word = cand;
        scored.Score = LangModel.Score(candSentence);
        if (!(scored.Word == w)) {
            if (knownWord) {
                if (firstLevel) {
                    scored.Score -= KnownWordsPenalty;
                } else {
                    scored.Score *= 50.0;
                }
            } else {
                scored.Score -= UnknownWordsPenalty;
            }
        }
        scoredCandidates.push_back(scored);
    }

    std::sort(scoredCandidates.begin(), scoredCandidates.end(), [](TScoredWord w1, TScoredWord w2) {
        return w1.Score > w2.Score;
    });
    return scoredCandidates;
}